

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O3

ostream * operator<<(ostream *os,vec4f *v)

{
  ostream *poVar1;
  char local_15;
  char local_14;
  char local_13;
  char local_12;
  char local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_15,1);
  poVar1 = std::ostream::_M_insert<double>((double)*(float *)v);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_14,1);
  poVar1 = std::ostream::_M_insert<double>((double)*(float *)(v + 4));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_13,1);
  poVar1 = std::ostream::_M_insert<double>((double)*(float *)(v + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_12,1);
  poVar1 = std::ostream::_M_insert<double>((double)*(float *)(v + 0xc));
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_11,1);
  return poVar1;
}

Assistant:

std::ostream& operator << (std::ostream& os, const vec4f& v) {
	return os << '(' << v.x << ',' << v.y << ',' << v.z << ',' << v.w << ')';
}